

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManBalance_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  Bal_Man_t *p_00;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong in_R8;
  uint *puVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  int local_68;
  uint local_64;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x370,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar14 = p->pObjs;
  if ((pObj < pGVar14) || (pGVar14 + p->nObjs <= pObj)) {
LAB_00701daf:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  puVar1 = p->pMuxes;
  if ((puVar1 != (uint *)0x0) &&
     (puVar1[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555] != 0)) {
    Gia_ManBalance_rec(pNew,p,pObj + -(ulong)uVar3);
    Gia_ManBalance_rec(pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (p->pMuxes == (uint *)0x0) {
      pGVar14 = (Gia_Obj_t *)0x0;
    }
    else {
      pGVar14 = p->pObjs;
      if ((pObj < pGVar14) || (pGVar14 + p->nObjs <= pObj)) goto LAB_00701daf;
      uVar3 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555];
      if ((int)uVar3 < 0) goto LAB_00701d14;
      uVar3 = uVar3 >> 1;
      if (p->nObjs <= (int)uVar3) goto LAB_00701d90;
      pGVar14 = pGVar14 + uVar3;
    }
    Gia_ManBalance_rec(pNew,p,pGVar14);
    pGVar14 = p->pObjs;
    if ((pGVar14 <= pObj) && (pObj < pGVar14 + p->nObjs)) {
      uVar3 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555];
      if (-1 < (int)uVar3) {
        if ((int)(uVar3 >> 1) < p->nObjs) {
          if (-1 < (int)pGVar14[uVar3 >> 1].Value) {
            uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
            if (-1 < (int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value) {
              uVar20 = (uint)*(undefined8 *)pObj;
              if (-1 < (int)pObj[-(ulong)(uVar20 & 0x1fffffff)].Value) {
                uVar3 = pGVar14[uVar3 >> 1].Value ^ uVar3 & 1;
                pGVar14 = (Gia_Obj_t *)(ulong)uVar3;
                uVar3 = Gia_ManHashMuxReal(pNew,uVar3,
                                           uVar4 >> 0x1d & 1 ^
                                           pObj[-(ulong)(uVar4 & 0x1fffffff)].Value,
                                           pObj[-(ulong)(uVar20 & 0x1fffffff)].Value ^
                                           uVar20 >> 0x1d & 1);
                pObj->Value = uVar3;
                Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar14,uVar3);
                return;
              }
            }
          }
LAB_00701d71:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
LAB_00701d90:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
LAB_00701d14:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    goto LAB_00701daf;
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar7->pArray = piVar9;
    p->vSuper = pVVar7;
  }
  else {
    p->vSuper->nSize = 0;
  }
  uVar22 = *(ulong *)pObj;
  uVar3 = (uint)uVar22;
  if (((int)uVar3 < 0) || (uVar4 = uVar3 & 0x1fffffff, uVar4 == 0x1fffffff)) {
LAB_00701e2b:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x30f,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar20 = (uint)(uVar22 >> 0x20) & 0x1fffffff;
  if ((uVar3 & 0x1fffffff) < uVar20) {
    if ((uVar22 & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                    ,0x2fc,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)uVar4);
    Gia_ManSuperCollectXor_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    pVVar7 = p->vSuper;
    uVar4 = pVVar7->nSize;
    uVar22 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar20 = 0;
      uVar3 = 0;
    }
    else {
      piVar9 = pVVar7->pArray;
      in_R8 = 0xffffffff;
      lVar13 = 0;
      uVar3 = 0;
      uVar20 = 0;
      do {
        uVar4 = piVar9[lVar13];
        if (uVar4 != 0) {
          if (uVar4 == 1) {
            uVar3 = uVar3 ^ 1;
          }
          else if ((uint)in_R8 == uVar4) {
            uVar20 = uVar20 - 1;
            in_R8 = 0xffffffff;
          }
          else {
            if (((int)uVar20 < 0) || ((int)uVar22 <= (int)uVar20)) goto LAB_00701d52;
            uVar22 = (ulong)uVar20;
            uVar20 = uVar20 + 1;
            piVar9[uVar22] = uVar4;
            in_R8 = (ulong)uVar4;
          }
        }
        lVar13 = lVar13 + 1;
        uVar4 = pVVar7->nSize;
        uVar22 = (ulong)(int)uVar4;
      } while (lVar13 < (long)uVar22);
    }
    if ((int)uVar4 < (int)uVar20) goto LAB_00701e0c;
    pVVar7->nSize = uVar20;
    if (uVar20 == 0) {
LAB_007013c2:
      Vec_IntPush(pVVar7,uVar3);
    }
    else if (uVar3 != 0) {
      if ((int)uVar20 < 1) {
LAB_00701cf5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = *pVVar7->pArray;
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      *pVVar7->pArray = uVar3 ^ 1;
    }
  }
  else {
    if (((uVar3 & 0x1fffffff) <= uVar20) ||
       ((puVar1 != (uint *)0x0 &&
        (puVar1[(int)((ulong)((long)pObj - (long)pGVar14) >> 2) * -0x55555555] != 0))))
    goto LAB_00701e2b;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)uVar4)));
    uVar3 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar3 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar3 & 0x1fffffff))));
    qsort(p->vSuper->pArray,(long)p->vSuper->nSize,4,Vec_IntSortCompare1);
    pVVar7 = p->vSuper;
    uVar3 = pVVar7->nSize;
    uVar22 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    else {
      piVar9 = pVVar7->pArray;
      lVar13 = 0;
      uVar20 = 0xffffffff;
      uVar4 = 0;
      do {
        uVar3 = piVar9[lVar13];
        in_R8 = (ulong)uVar3;
        if (uVar3 != 1) {
          if (uVar3 == 0) {
LAB_007013cd:
            if (pVVar7->nCap < 1) {
              if (piVar9 == (int *)0x0) {
                piVar9 = (int *)malloc(4);
              }
              else {
                piVar9 = (int *)realloc(piVar9,4);
              }
              pVVar7->pArray = piVar9;
              if (piVar9 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar7->nCap = 1;
            }
            *pVVar7->pArray = 0;
            pVVar7->nSize = 1;
            goto LAB_00701421;
          }
          if (uVar20 != 0xffffffff) {
            if (((int)uVar20 < 0) || ((int)uVar3 < 0)) goto LAB_00701d14;
            if ((uVar3 ^ uVar20) < 2) {
              if (uVar20 == uVar3) goto LAB_00701260;
              goto LAB_007013cd;
            }
          }
          if (((int)uVar4 < 0) || ((int)uVar22 <= (int)uVar4)) goto LAB_00701d52;
          uVar22 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          piVar9[uVar22] = uVar3;
          uVar20 = uVar3;
        }
LAB_00701260:
        lVar13 = lVar13 + 1;
        uVar3 = pVVar7->nSize;
        uVar22 = (ulong)(int)uVar3;
      } while (lVar13 < (long)uVar22);
    }
    if ((int)uVar3 < (int)uVar4) goto LAB_00701e0c;
    pVVar7->nSize = uVar4;
    if (uVar4 == 0) {
      uVar3 = 1;
      goto LAB_007013c2;
    }
  }
LAB_00701421:
  pVVar7 = p->vSuper;
  if (pVVar7->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSuper) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x312,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->vStore == (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 1000;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(4000);
    pVVar8->pArray = piVar9;
    p->vStore = pVVar8;
  }
  pVVar8 = p->vStore;
  uVar3 = pVVar8->nSize;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      Vec_IntPush(pVVar8,pVVar7->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar7->nSize);
  }
  iVar6 = p->vStore->nSize;
  uVar4 = iVar6 - uVar3;
  uVar22 = (ulong)uVar3;
  if (uVar4 != 0 && (int)uVar3 <= iVar6) {
    do {
      if ((int)uVar3 < 0) goto LAB_00701cf5;
      if (p->vStore->nSize <= (int)uVar22) goto LAB_00701cf5;
      uVar20 = p->vStore->pArray[uVar22];
      if ((int)uVar20 < 0) goto LAB_00701d14;
      if (p->nObjs <= (int)(uVar20 >> 1)) goto LAB_00701d90;
      pGVar14 = p->pObjs;
      Gia_ManBalance_rec(pNew,p,pGVar14 + (uVar20 >> 1));
      uVar5 = pGVar14[uVar20 >> 1].Value;
      if ((int)uVar5 < 0) goto LAB_00701d71;
      if (p->vStore->nSize <= (int)uVar22) goto LAB_00701d52;
      p->vStore->pArray[uVar22] = uVar5 ^ uVar20 & 1;
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 < iVar6);
  }
  iVar11 = p->vStore->nSize;
  if (iVar11 != iVar6) {
    __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x38b,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  if (((int)uVar3 < 0) || (iVar11 <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  pVVar7 = p->vSuper;
  piVar9 = p->vStore->pArray + uVar3;
  pVVar7->nSize = 0;
  if (uVar4 == 2) {
    Vec_IntPush(pVVar7,*piVar9);
    Vec_IntPush(pVVar7,piVar9[1]);
    iVar6 = pVVar7->nSize;
    if (iVar6 < 1) {
LAB_00701ee5:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    pVVar7->nSize = iVar6 - 1U;
    if (iVar6 == 1) goto LAB_00701ee5;
    iVar11 = pVVar7->pArray[iVar6 - 1U];
    pVVar7->nSize = iVar6 - 2U;
    iVar6 = pVVar7->pArray[iVar6 - 2U];
    uVar4 = (uint)*(undefined8 *)pObj;
    if (((~uVar4 & 0x1fffffff) == 0 || (int)uVar4 < 0) ||
       (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar4 & 0x1fffffff))) {
      uVar4 = Gia_ManHashAnd(pNew,iVar11,iVar6);
    }
    else if (pNew->pMuxes == (uint *)0x0) {
      uVar4 = Gia_ManHashXor(pNew,iVar11,iVar6);
    }
    else {
      uVar4 = Gia_ManHashXorReal(pNew,iVar11,iVar6);
    }
    pGVar14 = (Gia_Obj_t *)(ulong)uVar4;
    Vec_IntPush(pVVar7,uVar4);
    Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar14,uVar4);
    lVar13 = (long)pVVar7->nSize;
    if (1 < lVar13) {
      do {
        if (pVVar7->nSize < lVar13) goto LAB_00701cf5;
        uVar4 = pVVar7->pArray[lVar13 + -1];
        if ((int)uVar4 < 0) goto LAB_00701d14;
        uVar20 = pVVar7->pArray[lVar13 + -2];
        iVar6 = Gia_ObjLevelId(pNew,uVar4 >> 1);
        if ((int)uVar20 < 0) goto LAB_00701d14;
        iVar11 = Gia_ObjLevelId(pNew,uVar20 >> 1);
        if (iVar6 <= iVar11) break;
        if (pVVar7->nSize < lVar13) {
LAB_00701d52:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar9 = pVVar7->pArray;
        piVar9[lVar13 + -1] = uVar20;
        if ((long)pVVar7->nSize <= lVar13 + -2) goto LAB_00701d52;
        piVar9[lVar13 + -2] = uVar4;
        lVar13 = lVar13 + -1;
      } while (1 < (int)lVar13);
    }
  }
  else if (uVar4 == 1) {
    Vec_IntPush(pVVar7,*piVar9);
  }
  else if (2 < (int)uVar4) {
    p_00 = (Bal_Man_t *)pNew->pData;
    uVar22 = 0;
    do {
      Vec_IntPush(pVVar7,piVar9[uVar22]);
      uVar22 = uVar22 + 1;
    } while (uVar4 != uVar22);
    iVar6 = pVVar7->nSize;
    if (1 < (long)iVar6) {
      piVar9 = pVVar7->pArray;
      pVVar8 = p_00->vCosts;
      lVar13 = 1;
      uVar22 = 0;
      do {
        in_R8 = uVar22 + 1;
        uVar15 = uVar22 & 0xffffffff;
        lVar23 = lVar13;
        do {
          if (piVar9[lVar23] < 0) goto LAB_00701d14;
          uVar4 = (uint)piVar9[lVar23] >> 1;
          iVar11 = pVVar8->nSize;
          if (iVar11 <= (int)uVar4) goto LAB_00701cf5;
          if (piVar9[(int)(uint)uVar15] < 0) goto LAB_00701d14;
          uVar20 = (uint)piVar9[(int)(uint)uVar15] >> 1;
          if (iVar11 <= (int)uVar20) goto LAB_00701cf5;
          piVar2 = pVVar8->pArray;
          uVar5 = (uint)lVar23;
          if (piVar2[uVar4] <= piVar2[uVar20]) {
            uVar5 = (uint)uVar15;
          }
          lVar23 = lVar23 + 1;
          uVar15 = (ulong)uVar5;
        } while (iVar6 != lVar23);
        iVar11 = piVar9[uVar22];
        piVar9[uVar22] = piVar9[(int)uVar5];
        piVar9[(int)uVar5] = iVar11;
        lVar13 = lVar13 + 1;
        uVar22 = in_R8;
      } while (in_R8 != iVar6 - 1);
    }
    uVar4 = pVVar7->nSize;
    while (1 < (int)uVar4) {
      piVar9 = pVVar7->pArray;
      uVar22 = (ulong)uVar4;
      if (piVar9[uVar22 - 1] < 0) goto LAB_00701d14;
      uVar20 = (uint)piVar9[uVar22 - 1] >> 1;
      iVar6 = p_00->vCosts->nSize;
      if (iVar6 <= (int)uVar20) goto LAB_00701cf5;
      piVar2 = p_00->vCosts->pArray;
      iVar11 = piVar2[uVar20] >> 4;
      uVar15 = uVar22;
      do {
        if ((long)uVar15 < 2) {
          uVar15 = 0;
          break;
        }
        if (piVar9[uVar15 - 2] < 0) goto LAB_00701d14;
        uVar20 = (uint)piVar9[uVar15 - 2] >> 1;
        if (iVar6 <= (int)uVar20) goto LAB_00701cf5;
        iVar18 = piVar2[uVar20] >> 4;
        if (iVar18 < iVar11) {
          __assert_fail("DelayCur >= Delay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                        ,0x24f,"int Vec_IntFindFirstSameDelayAsLast(Bal_Man_t *, Vec_Int_t *)");
        }
        uVar15 = uVar15 - 1;
      } while (iVar18 <= iVar11);
      iVar6 = (int)uVar15;
      if ((int)uVar4 <= iVar6) {
        __assert_fail("iBeg <= iEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                      ,0x268,"int Bal_ManFindBestPair(Bal_Man_t *, Vec_Int_t *, Gia_Obj_t *)");
      }
      if (iVar6 < 1) {
        uVar20 = 1000000000;
        local_64 = 0xffffffff;
        local_68 = -1;
      }
      else {
        local_68 = -1;
        uVar20 = 1000000000;
        local_64 = 0xffffffff;
        uVar16 = uVar15 & 0xffffffff;
        do {
          uVar17 = uVar16 - 1;
          uVar24 = uVar22;
          do {
            uVar5 = Bal_ManEvalTwo(p_00,piVar9[uVar24 - 1],piVar9[uVar17],0,(int)in_R8);
            if (uVar5 != 0xffffffff) {
              if (piVar9[uVar17] < 0) goto LAB_00701d14;
              uVar10 = (uint)piVar9[uVar17] >> 1;
              if (p_00->vCosts->nSize <= (int)uVar10) goto LAB_00701cf5;
              if (uVar5 == p_00->vCosts->pArray[uVar10]) {
                local_64 = (int)uVar17 << 0x10 | (int)uVar24 - 1U;
                goto LAB_007019c7;
              }
              if ((int)uVar5 < (int)uVar20) {
                local_64 = (int)uVar24 - 1;
                uVar20 = uVar5;
                local_68 = (int)uVar17;
              }
            }
            uVar24 = uVar24 - 1;
          } while ((long)(uVar15 & 0xffffffff) < (long)uVar24);
          bVar25 = 1 < (long)uVar16;
          uVar16 = uVar17;
        } while (bVar25);
      }
      if (uVar20 == 1000000000) {
LAB_007018cc:
        uVar20 = iVar6 * 0x10000;
        iVar11 = 1000000000;
        uVar15 = (long)iVar6;
        do {
          uVar20 = uVar20 + 0x10000;
          uVar16 = uVar15 + 1;
          uVar5 = uVar20;
          for (uVar24 = uVar16; (long)uVar24 < (long)uVar22; uVar24 = uVar24 + 1) {
            iVar6 = Bal_ManEvalTwo(p_00,piVar9[uVar15],piVar9[uVar24],0,(int)in_R8);
            if (iVar6 != -1) {
              if (piVar9[uVar15] < 0) goto LAB_00701d14;
              uVar10 = (uint)piVar9[uVar15] >> 1;
              iVar18 = p_00->vCosts->nSize;
              if (iVar18 <= (int)uVar10) goto LAB_00701cf5;
              if (piVar9[uVar24] < 0) goto LAB_00701d14;
              uVar19 = (uint)piVar9[uVar24] >> 1;
              if (iVar18 <= (int)uVar19) goto LAB_00701cf5;
              piVar2 = p_00->vCosts->pArray;
              iVar18 = piVar2[uVar10];
              iVar12 = piVar2[uVar19];
              if (iVar12 < iVar18) {
                iVar12 = iVar18;
              }
              if (iVar6 == iVar12) {
                local_64 = uVar5 | (uint)uVar15;
                goto LAB_007019c7;
              }
              if (iVar6 < iVar11) {
                local_68 = (int)uVar24;
                local_64 = (uint)uVar15;
                iVar11 = iVar6;
              }
            }
            uVar5 = uVar5 + 0x10000;
          }
          uVar15 = uVar16;
        } while (uVar16 != uVar22);
        if (iVar11 == 1000000000) {
          local_64 = uVar4 - 2 | uVar4 * 0x10000 - 0x10000;
        }
        else {
          local_64 = local_68 << 0x10 | local_64;
        }
      }
      else {
        if (piVar9[local_68] < 0) goto LAB_00701d14;
        uVar5 = (uint)piVar9[local_68] >> 1;
        if (p_00->vCosts->nSize <= (int)uVar5) goto LAB_00701cf5;
        if (0xf < (uVar20 ^ p_00->vCosts->pArray[uVar5])) goto LAB_007018cc;
        local_64 = local_68 << 0x10 | local_64;
      }
LAB_007019c7:
      uVar4 = (int)local_64 >> 0x10;
      if ((int)uVar4 < 0) goto LAB_00701cf5;
      uVar20 = pVVar7->nSize;
      if (((int)uVar20 <= (int)uVar4) || ((int)uVar20 <= (int)(local_64 & 0xffff)))
      goto LAB_00701cf5;
      puVar1 = (uint *)pVVar7->pArray;
      uVar4 = puVar1[uVar4];
      pGVar14 = (Gia_Obj_t *)(ulong)uVar4;
      if (*puVar1 == uVar4) {
        bVar25 = true;
        uVar15 = 0;
      }
      else {
        uVar22 = 0;
        do {
          if ((ulong)uVar20 - 1 == uVar22) {
            bVar25 = false;
            uVar15 = (ulong)uVar20;
            goto LAB_00701a2c;
          }
          uVar15 = uVar22 + 1;
          lVar13 = uVar22 + 1;
          uVar22 = uVar15;
        } while (puVar1[lVar13] != uVar4);
        bVar25 = uVar15 < uVar20;
      }
LAB_00701a2c:
      uVar5 = puVar1[local_64 & 0xffff];
      if ((uint)uVar15 != uVar20) {
        if (!bVar25) goto LAB_00701ded;
        uVar10 = (uint)uVar15 + 1;
        if ((int)uVar10 < (int)uVar20) {
          puVar21 = puVar1 + uVar10;
          do {
            iVar6 = (int)uVar15;
            puVar1[uVar15 & 0xffffffff] = *puVar21;
            uVar20 = pVVar7->nSize;
            puVar21 = puVar21 + 1;
            uVar15 = (ulong)(iVar6 + 1);
          } while (iVar6 + 2 < (int)uVar20);
        }
        pVVar7->nSize = uVar20 - 1;
      }
      uVar20 = pVVar7->nSize;
      uVar22 = 0;
      bVar25 = 0 < (int)uVar20;
      if ((0 < (int)uVar20) && (bVar25 = true, *puVar1 != uVar5)) {
        uVar15 = 0;
        do {
          if ((ulong)uVar20 - 1 == uVar15) {
            bVar25 = false;
            uVar22 = (ulong)uVar20;
            goto LAB_00701ab6;
          }
          uVar22 = uVar15 + 1;
          lVar13 = uVar15 + 1;
          uVar15 = uVar22;
        } while (puVar1[lVar13] != uVar5);
        bVar25 = uVar22 < uVar20;
      }
LAB_00701ab6:
      if ((uint)uVar22 != uVar20) {
        if (!bVar25) {
LAB_00701ded:
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar10 = (uint)uVar22 + 1;
        if ((int)uVar10 < (int)uVar20) {
          puVar21 = puVar1 + uVar10;
          do {
            iVar6 = (int)uVar22;
            puVar1[uVar22 & 0xffffffff] = *puVar21;
            uVar20 = pVVar7->nSize;
            puVar21 = puVar21 + 1;
            uVar22 = (ulong)(iVar6 + 1);
          } while (iVar6 + 2 < (int)uVar20);
        }
        pVVar7->nSize = uVar20 - 1;
      }
      uVar20 = (uint)*(undefined8 *)pObj;
      bVar25 = (~uVar20 & 0x1fffffff) == 0 || (int)uVar20 < 0;
      in_R8 = (ulong)CONCAT31((int3)(~uVar20 >> 8),bVar25);
      if ((bVar25) ||
         (in_R8 = 0x1fffffff,
         ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar20 & 0x1fffffff))) {
        iVar6 = Gia_ManHashAnd(pNew,uVar4,uVar5);
      }
      else {
        iVar6 = Gia_ManHashXorReal(pNew,uVar4,uVar5);
      }
      Bal_ManSetGateLevel(p_00,pGVar14,iVar6);
      pVVar8 = p_00->vCosts;
      Vec_IntPush(pVVar7,iVar6);
      if (1 < pVVar7->nSize) {
        piVar9 = pVVar7->pArray;
        uVar4 = pVVar7->nSize;
        do {
          uVar20 = uVar4 - 1;
          uVar5 = piVar9[uVar20];
          if ((int)uVar5 < 0) goto LAB_00701d14;
          iVar6 = pVVar8->nSize;
          if (iVar6 <= (int)(uVar5 >> 1)) goto LAB_00701cf5;
          uVar10 = piVar9[(ulong)uVar4 - 2];
          in_R8 = (ulong)uVar10;
          if ((int)uVar10 < 0) goto LAB_00701d14;
          if (iVar6 <= (int)(uVar10 >> 1)) goto LAB_00701cf5;
          piVar2 = pVVar8->pArray;
          if (piVar2[uVar5 >> 1] <= piVar2[uVar10 >> 1]) break;
          piVar9[uVar20] = uVar10;
          piVar9[(ulong)uVar4 - 2] = uVar5;
          bVar25 = 2 < (int)uVar4;
          uVar4 = uVar20;
        } while (bVar25);
      }
      uVar4 = pVVar7->nSize;
    }
  }
  if (pVVar7->nSize != 1) {
    __assert_fail("Vec_IntSize(vSuper) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x35c,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  pObj->Value = *pVVar7->pArray;
  if ((int)uVar3 <= p->vStore->nSize) {
    p->vStore->nSize = uVar3;
    return;
  }
LAB_00701e0c:
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManBalance_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    int i, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    // handle MUX
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin1(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin2(p, pObj), fStrict );
        pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj, fStrict );
    // save entries
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( 1000 );
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Gia_ManBalance_rec( pNew, p, pTemp, fStrict );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, Vec_IntEntryP(p->vStore, iBeg), iEnd-iBeg );
    Vec_IntShrink( p->vStore, iBeg );
}